

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::rehash
          (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *this,size_t sizeHint)

{
  ProString *str;
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  Entry *pEVar9;
  ulong uVar10;
  Node<ProKey,_QMakeInternal::QMakeBuiltin> *this_00;
  ulong uVar11;
  size_t index;
  long lVar12;
  size_t sVar13;
  long lVar14;
  R RVar15;
  Bucket BVar16;
  Span *local_50;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar13 = 0x80;
  if ((0x40 < sizeHint) && (sVar13 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar13 = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar15 = allocateSpans(sVar13);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = sVar13;
  if (uVar1 < 0x80) {
    if (pSVar2 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar11 = 0;
    local_50 = pSVar2;
    do {
      lVar12 = 0;
      do {
        uVar10 = (ulong)local_50->offsets[lVar12];
        if (uVar10 != 0xff) {
          pEVar3 = pSVar2[uVar11].entries;
          str = (ProString *)(pEVar3 + uVar10);
          uVar4 = this->seed;
          sVar13 = qHash(str);
          BVar16 = findBucketWithHash<ProKey>(this,(ProKey *)str,uVar4 ^ sVar13);
          this_00 = Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::insert
                              (BVar16.span,BVar16.index);
          ProString::ProString((ProString *)this_00,str);
          pDVar5 = *(Data **)(pEVar3[uVar10].storage.data + 0x30);
          pEVar9 = pEVar3 + uVar10;
          (pEVar9->storage).data[0x30] = '\0';
          (pEVar9->storage).data[0x31] = '\0';
          (pEVar9->storage).data[0x32] = '\0';
          (pEVar9->storage).data[0x33] = '\0';
          (pEVar9->storage).data[0x34] = '\0';
          (pEVar9->storage).data[0x35] = '\0';
          (pEVar9->storage).data[0x36] = '\0';
          (pEVar9->storage).data[0x37] = '\0';
          (this_00->value).usage.d.d = pDVar5;
          pcVar6 = *(char16_t **)(pEVar3[uVar10].storage.data + 0x38);
          pEVar9 = pEVar3 + uVar10;
          (pEVar9->storage).data[0x38] = '\0';
          (pEVar9->storage).data[0x39] = '\0';
          (pEVar9->storage).data[0x3a] = '\0';
          (pEVar9->storage).data[0x3b] = '\0';
          (pEVar9->storage).data[0x3c] = '\0';
          (pEVar9->storage).data[0x3d] = '\0';
          (pEVar9->storage).data[0x3e] = '\0';
          (pEVar9->storage).data[0x3f] = '\0';
          (this_00->value).usage.d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar3[uVar10].storage.data + 0x40);
          pEVar9 = pEVar3 + uVar10;
          (pEVar9->storage).data[0x40] = '\0';
          (pEVar9->storage).data[0x41] = '\0';
          (pEVar9->storage).data[0x42] = '\0';
          (pEVar9->storage).data[0x43] = '\0';
          (pEVar9->storage).data[0x44] = '\0';
          (pEVar9->storage).data[0x45] = '\0';
          (pEVar9->storage).data[0x46] = '\0';
          (pEVar9->storage).data[0x47] = '\0';
          (this_00->value).usage.d.size = qVar7;
          uVar8 = *(undefined8 *)(pEVar3[uVar10].storage.data + 0x48);
          (this_00->value).index = (int)uVar8;
          (this_00->value).minArgs = (int)((ulong)uVar8 >> 0x20);
          (this_00->value).maxArgs = *(int *)(pEVar3[uVar10].storage.data + 0x50);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::freeData(pSVar2 + uVar11);
      uVar11 = uVar11 + 1;
      local_50 = local_50 + 1;
    } while (uVar11 != uVar1 >> 7);
  }
  lVar12 = *(long *)&pSVar2[-1].allocated;
  if (lVar12 != 0) {
    lVar14 = lVar12 * 0x90;
    do {
      Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::freeData
                ((Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)
                 (pSVar2[-1].offsets + lVar14));
      lVar14 = lVar14 + -0x90;
    } while (lVar14 != 0);
  }
  operator_delete__(&pSVar2[-1].allocated,lVar12 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }